

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

void pzshape::TPZShapeLinear::TransformPoint1d(int transid,FADREAL *in,FADREAL *out)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  if (transid == 0) {
    out->val_ = in->val_;
    Vector<double>::operator=(&out->dx_,&in->dx_);
    out->defaultVal = in->defaultVal;
    return;
  }
  uVar1 = (in->dx_).num_elts;
  uVar8 = (ulong)uVar1;
  uVar2 = (out->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00fd57c9;
    pdVar5 = (out->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (out->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (out->dx_).num_elts = 0;
        (out->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00fd57c9;
    }
    if (uVar2 != 0) {
      pdVar5 = (out->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      (out->dx_).ptr_to_data = (double *)0x0;
    }
    (out->dx_).num_elts = uVar1;
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    (out->dx_).ptr_to_data = pdVar5;
    auVar4 = _DAT_014d28c0;
    if ((in->dx_).num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar6 = (ulong)in->defaultVal ^ (ulong)DAT_014d2310;
        lVar7 = uVar8 - 1;
        auVar9._8_4_ = (int)lVar7;
        auVar9._0_8_ = lVar7;
        auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar9 = auVar9 ^ _DAT_014d28c0;
        auVar10 = _DAT_014d28b0;
        do {
          auVar12 = auVar10 ^ auVar4;
          if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                      auVar9._4_4_ < auVar12._4_4_) & 1)) {
            *(ulong *)((long)pdVar5 + lVar7) = uVar6;
          }
          if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
              auVar12._12_4_ <= auVar9._12_4_) {
            *(ulong *)((long)pdVar5 + lVar7 + 8) = uVar6;
          }
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar11 + 2;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(uVar1 + 1 >> 1) << 4 != lVar7);
      }
      goto LAB_00fd57c9;
    }
  }
  if (0 < (int)uVar1) {
    pdVar3 = (in->dx_).ptr_to_data;
    uVar6 = 0;
    do {
      pdVar5[uVar6] = -pdVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
LAB_00fd57c9:
  out->val_ = -in->val_;
  return;
}

Assistant:

void TPZShapeLinear::TransformPoint1d(int transid,FADREAL & in,FADREAL &out) {
		if (!transid) out =  in;
		else          out = -in;
	}